

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_dform39(DisasContext_conflict10 *ctx)

{
  _Bool _Var1;
  TCGContext_conflict10 *pTVar2;
  TCGTemp *pTVar3;
  TCGTemp *pTVar4;
  uint32_t excp;
  TCGContext_conflict10 *s;
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 pTVar5;
  
  switch(ctx->opcode & 3) {
  case 0:
    if ((ctx->insns_flags2 & 0x20) == 0) goto switchD_00b93121_caseD_1;
    if (ctx->fpu_enabled == false) {
      excp = 7;
      goto LAB_00b93482;
    }
    s = ctx->uc->tcg_ctx;
    if ((ctx->need_access_type == true) && (ctx->access_type != 0x30)) {
      tcg_gen_op2_ppc64(s,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)s),0x30);
      ctx->access_type = 0x30;
    }
    pTVar4 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    pTVar5 = (TCGv_i64)((long)pTVar4 - (long)s);
    gen_addr_imm_index(ctx,pTVar5,0);
    pTVar3 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    _Var1 = ctx->le_mode;
    tcg_gen_qemu_ld_i64_ppc64
              (ctx->uc->tcg_ctx,(TCGv_i64)((long)pTVar3 - (long)s),pTVar5,(long)ctx->mem_idx,
               ctx->default_tcg_memop_mask | MO_64);
    tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)pTVar3,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)((uint)_Var1 * 0x10 + 0x12b28 + (ctx->opcode >> 0x11 & 0x1f0)));
    tcg_gen_addi_i64_ppc64(s,pTVar5,pTVar5,8);
    tcg_gen_qemu_ld_i64_ppc64
              (ctx->uc->tcg_ctx,(TCGv_i64)((long)pTVar3 - (long)s),pTVar5,(long)ctx->mem_idx,
               ctx->default_tcg_memop_mask | MO_64);
    tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)pTVar3,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)((ctx->opcode >> 0x11 & 0x1f0) + 0x12b28 + (uint)(_Var1 ^ 1) * 0x10));
    tcg_temp_free_internal_ppc64(s,pTVar4);
    goto LAB_00b9345d;
  case 1:
switchD_00b93121_caseD_1:
    gen_exception_err(ctx,0x60,0x21);
    return;
  case 2:
    if ((ctx->insns_flags2 & 0x80000) == 0) goto switchD_00b93121_caseD_1;
    if (ctx->altivec_enabled == false) {
LAB_00b93470:
      excp = 0x49;
LAB_00b93482:
      gen_exception(ctx,excp);
      return;
    }
    s = ctx->uc->tcg_ctx;
    pTVar3 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    pTVar5 = (TCGv_i64)((long)pTVar3 - (long)s);
    if ((ctx->need_access_type == true) && (ctx->access_type != 0x20)) {
      pTVar2 = ctx->uc->tcg_ctx;
      tcg_gen_op2_ppc64(pTVar2,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)pTVar2),0x20);
      ctx->access_type = 0x20;
    }
    pTVar4 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    gen_addr_imm_index(ctx,(TCGv_i64)((long)pTVar4 - (long)s),3);
    tcg_gen_qemu_ld_i64_ppc64
              (ctx->uc->tcg_ctx,pTVar5,(TCGv_i64)((long)pTVar4 - (long)s),(long)ctx->mem_idx,
               ctx->default_tcg_memop_mask | MO_64);
    break;
  case 3:
    if ((ctx->insns_flags2 & 0x80000) == 0) goto switchD_00b93121_caseD_1;
    if (ctx->altivec_enabled == false) goto LAB_00b93470;
    s = ctx->uc->tcg_ctx;
    pTVar3 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    pTVar5 = (TCGv_i64)((long)pTVar3 - (long)s);
    if ((ctx->need_access_type == true) && (ctx->access_type != 0x20)) {
      pTVar2 = ctx->uc->tcg_ctx;
      tcg_gen_op2_ppc64(pTVar2,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)pTVar2),0x20);
      ctx->access_type = 0x20;
    }
    pTVar4 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    gen_addr_imm_index(ctx,(TCGv_i64)((long)pTVar4 - (long)s),3);
    gen_qemu_ld32fs(ctx,pTVar5,(TCGv_i64)((long)pTVar4 - (long)s));
  }
  tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)pTVar3,(TCGArg)(s->cpu_env + (long)s),
                    (ulong)(ctx->opcode >> 0x11 & 0x1f0) + 0x12d28);
  tcg_temp_free_internal_ppc64(s,pTVar4);
  pTVar3 = (TCGTemp *)(pTVar5 + (long)s);
LAB_00b9345d:
  tcg_temp_free_internal_ppc64(s,pTVar3);
  return;
}

Assistant:

static void gen_dform39(DisasContext *ctx)
{
    switch (ctx->opcode & 0x3) {
    case 0: /* lfdp */
        if (ctx->insns_flags2 & PPC2_ISA205) {
            return gen_lfdp(ctx);
        }
        break;
    case 2: /* lxsd */
        if (ctx->insns_flags2 & PPC2_ISA300) {
            return gen_lxsd(ctx);
        }
        break;
    case 3: /* lxssp */
        if (ctx->insns_flags2 & PPC2_ISA300) {
            return gen_lxssp(ctx);
        }
        break;
    }
    return gen_invalid(ctx);
}